

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potpourri.cpp
# Opt level: O2

ostream * operator<<(ostream *os,Vec<float,_3UL> *v)

{
  ostream *poVar1;
  long lVar2;
  long extraout_RDX;
  int i;
  long lVar3;
  
  std::operator<<(os,'[');
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(os,v->data[lVar3]);
    std::operator<<(poVar1,", ");
  }
  poVar1 = (ostream *)std::ostream::operator<<(os,v->data[2]);
  lVar3 = 0x5d;
  std::operator<<(poVar1,']');
  *(undefined4 *)(poVar1 + 8) = 0;
  *(undefined8 *)poVar1 = 0;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    *(float *)(poVar1 + lVar2 * 4) =
         *(float *)(lVar3 + lVar2 * 4) * *(float *)(extraout_RDX + lVar2 * 4);
  }
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Vec<T, N>& v) {
        os << '[';

        for (int i = 0; i < N - 1; i++) {
            os << v.data[i] << ", ";
        }

        os << v.data[N - 1] << ']';
    }